

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O2

int test_cube(void)

{
  int iVar1;
  int iVar2;
  MTBDD vars;
  BDD BVar3;
  double arg_1;
  BDD BVar4;
  BDD BVar5;
  MTBDD MVar6;
  undefined8 uVar7;
  BDDVAR arg_3;
  BDDVAR arg_3_00;
  BDDVAR arg_3_01;
  BDDVAR arg_3_02;
  BDDVAR arg_3_03;
  BDDVAR arg_3_04;
  BDDVAR arg_3_05;
  long lVar8;
  char *pcVar9;
  ulong arg_1_00;
  bool bVar10;
  uint8_t cube [6];
  uint8_t arr [6];
  uint8_t check [6];
  uint8_t local_80 [8];
  uint8_t local_78 [8];
  uint8_t local_70 [8];
  uint8_t local_68 [8];
  uint8_t local_60 [8];
  uint8_t local_58 [8];
  uint8_t local_50 [8];
  uint32_t local_48 [6];
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_48[4] = 6;
  local_48[5] = 8;
  vars = mtbdd_set_from_array(local_48,6);
  for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
    iVar1 = rng(0,3);
    cube[lVar8] = (uint8_t)iVar1;
  }
  BVar3 = sylvan_cube(vars,cube);
  sylvan_sat_one(BVar3,vars,check);
  for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
    if ((cube[lVar8] != check[lVar8]) && ((cube[lVar8] != '\x02' || (check[lVar8] != '\0')))) {
      pcVar9 = "cube[i] == check[i] || (cube[i] == 2 && check[i] == 0)";
      uVar7 = 199;
      goto LAB_00103069;
    }
  }
  arg_1 = (double)sylvan_sat_single(BVar3,vars);
  BVar4 = sylvan_and_RUN((BDD)arg_1,BVar3,arg_3);
  iVar1 = testEqual(BVar4,(BDD)arg_1);
  if (iVar1 == 0) {
    pcVar9 = "testEqual(sylvan_and(picked_single, bdd), picked_single)";
    uVar7 = 0xca;
  }
  else {
    _arr = sylvan_satcount_WRAP;
    lace_run_task((Task *)arr);
    if ((arg_1 != 1.0) || (NAN(arg_1))) {
      __assert_fail("sylvan_satcount(picked_single, vars)==1",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                    ,0xcb,"int test_cube()");
    }
    BVar4 = sylvan_sat_one_bdd(BVar3);
    BVar3 = sylvan_and_RUN(BVar4,BVar3,arg_3_00);
    iVar1 = testEqual(BVar3,BVar4);
    if (iVar1 == 0) {
      pcVar9 = "testEqual(sylvan_and(picked, bdd), picked)";
      uVar7 = 0xce;
    }
    else {
      builtin_memcpy(local_50,"\x01\x01\x02\x02",5);
      local_50[5] = '\0';
      BVar3 = sylvan_cube(vars,local_50);
      builtin_memcpy(local_58,"\x01\x01\x01",4);
      local_58[4] = '\0';
      local_58[5] = '\x02';
      BVar4 = sylvan_cube(vars,local_58);
      builtin_memcpy(local_60,"\x01\x01\x01",4);
      local_60[4] = '\0';
      local_60[5] = '\x02';
      BVar5 = sylvan_union_cube_RUN(BVar3,vars,local_60);
      arg_1_00 = BVar3 ^ 0x8000000000000000;
      BVar4 = sylvan_and_RUN(arg_1_00,BVar4 ^ 0x8000000000000000,arg_3_01);
      iVar1 = testEqual(BVar5,BVar4 ^ 0x8000000000000000);
      if (iVar1 == 0) {
        pcVar9 = 
        "testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){1,1,1,0,0,2})), sylvan_or(t1, t2))";
        uVar7 = 0xd2;
      }
      else {
        builtin_memcpy(local_68,"\x02\x02\x02\x01\x01",6);
        BVar4 = sylvan_cube(vars,local_68);
        builtin_memcpy(local_70,"\x02\x02\x02\x01\x01",6);
        BVar5 = sylvan_union_cube_RUN(BVar3,vars,local_70);
        BVar4 = sylvan_and_RUN(arg_1_00,BVar4 ^ 0x8000000000000000,arg_3_02);
        iVar1 = testEqual(BVar5,BVar4 ^ 0x8000000000000000);
        if (iVar1 == 0) {
          pcVar9 = 
          "testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){2,2,2,1,1,0})), sylvan_or(t1, t2))";
          uVar7 = 0xd4;
        }
        else {
          builtin_memcpy(local_78,"\x01\x01\x01",4);
          local_78[4] = '\0';
          local_78[5] = '\0';
          BVar4 = sylvan_cube(vars,local_78);
          builtin_memcpy(local_80,"\x01\x01\x01",4);
          local_80[4] = '\0';
          local_80[5] = '\0';
          BVar3 = sylvan_union_cube_RUN(BVar3,vars,local_80);
          BVar4 = sylvan_and_RUN(arg_1_00,BVar4 ^ 0x8000000000000000,arg_3_03);
          iVar1 = testEqual(BVar3,BVar4 ^ 0x8000000000000000);
          if (iVar1 == 0) {
            pcVar9 = 
            "testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){1,1,1,0,0,0})), sylvan_or(t1, t2))";
            uVar7 = 0xd6;
          }
          else {
            BVar3 = make_random(1,0x10);
            iVar1 = 0;
            do {
              if (iVar1 == 10) {
                iVar1 = 0xb;
                goto LAB_001029bb;
              }
              for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
                iVar2 = rng(0,3);
                cube[lVar8] = (uint8_t)iVar2;
              }
              BVar4 = sylvan_cube(vars,cube);
              BVar5 = sylvan_union_cube_RUN(BVar3,vars,cube);
              BVar4 = sylvan_and_RUN(BVar3 ^ 0x8000000000000000,BVar4 ^ 0x8000000000000000,arg_3_04)
              ;
              iVar1 = iVar1 + 1;
            } while ((BVar4 ^ BVar5) == 0x8000000000000000);
            pcVar9 = "sylvan_union_cube(bdd, vars, cube) == sylvan_or(bdd, c)";
            uVar7 = 0xdc;
          }
        }
      }
    }
  }
  goto LAB_00103069;
  while( true ) {
    BVar4 = sylvan_sat_one_bdd(BVar3);
    BVar5 = sylvan_and_RUN(BVar4,BVar3,arg_3_05);
    iVar2 = testEqual(BVar5,BVar4);
    if (iVar2 == 0) break;
LAB_001029bb:
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      MVar6 = mtbdd_enum_all_first(0x8000000000000000,vars,arr,(mtbdd_enum_filter_cb)0x0);
      if (MVar6 != 0x8000000000000000) {
        pcVar9 = "leaf == mtbdd_true";
        uVar7 = 0xe7;
        goto LAB_00103069;
      }
      MVar6 = mtbdd_enum_all_first(0x8000000000000000,vars,arr,(mtbdd_enum_filter_cb)0x0);
      if (MVar6 != 0x8000000000000000) {
        pcVar9 = "mtbdd_enum_all_first(mtbdd_true, vars, arr, NULL) == mtbdd_true";
        uVar7 = 0xe8;
        goto LAB_00103069;
      }
      if (((arr._0_4_ != 0) || (arr[4] != '\0')) || (arr[5] != '\0')) {
        pcVar9 = 
        "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 0 && arr[5] == 0";
        uVar7 = 0xe9;
        goto LAB_00103069;
      }
      MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,arr,(mtbdd_enum_filter_cb)0x0);
      if (MVar6 != 0x8000000000000000) {
        pcVar9 = "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true";
        uVar7 = 0xea;
        goto LAB_00103069;
      }
      if (((arr._0_4_ != 0) || (arr[4] != '\0')) || (arr[5] != '\x01')) {
        pcVar9 = 
        "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 0 && arr[5] == 1";
        uVar7 = 0xeb;
        goto LAB_00103069;
      }
      MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,arr,(mtbdd_enum_filter_cb)0x0);
      if (MVar6 != 0x8000000000000000) {
        pcVar9 = "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true";
        uVar7 = 0xec;
        goto LAB_00103069;
      }
      if (((arr._0_4_ != 0) || (arr[4] != '\x01')) || (arr[5] != '\0')) {
        pcVar9 = 
        "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 1 && arr[5] == 0";
        uVar7 = 0xed;
        goto LAB_00103069;
      }
      MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,arr,(mtbdd_enum_filter_cb)0x0);
      if (MVar6 != 0x8000000000000000) {
        pcVar9 = "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true";
        uVar7 = 0xee;
        goto LAB_00103069;
      }
      if (((arr._0_4_ != 0) || (arr[4] != '\x01')) || (arr[5] != '\x01')) {
        pcVar9 = 
        "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 1 && arr[5] == 1";
        uVar7 = 0xef;
        goto LAB_00103069;
      }
      MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,arr,(mtbdd_enum_filter_cb)0x0);
      if (MVar6 != 0x8000000000000000) {
        pcVar9 = "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true";
        uVar7 = 0xf0;
        goto LAB_00103069;
      }
      if (((arr._0_4_ != 0x1000000) || (arr[4] != '\0')) || (arr[5] != '\0')) {
        pcVar9 = 
        "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 0 && arr[5] == 0";
        uVar7 = 0xf1;
        goto LAB_00103069;
      }
      MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,arr,(mtbdd_enum_filter_cb)0x0);
      if (MVar6 != 0x8000000000000000) {
        pcVar9 = "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true";
        uVar7 = 0xf2;
        goto LAB_00103069;
      }
      if (((arr._0_4_ != 0x1000000) || (arr[4] != '\0')) || (arr[5] != '\x01')) {
        pcVar9 = 
        "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 0 && arr[5] == 1";
        uVar7 = 0xf3;
        goto LAB_00103069;
      }
      MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,arr,(mtbdd_enum_filter_cb)0x0);
      if (MVar6 != 0x8000000000000000) {
        pcVar9 = "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true";
        uVar7 = 0xf4;
        goto LAB_00103069;
      }
      if (((arr._0_4_ != 0x1000000) || (arr[4] != '\x01')) || (arr[5] != '\0')) {
        pcVar9 = 
        "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 1 && arr[5] == 0";
        uVar7 = 0xf5;
        goto LAB_00103069;
      }
      mtbdd_enum_all_first(0x8000000000000000,vars,arr,(mtbdd_enum_filter_cb)0x0);
      lVar8 = 0x3f;
      goto LAB_00102bfe;
    }
  }
  pcVar9 = "testEqual(sylvan_and(picked, bdd), picked)";
  uVar7 = 0xe1;
  goto LAB_00103069;
  while (bVar10 = lVar8 != 0, lVar8 = lVar8 + -1, bVar10) {
LAB_00102bfe:
    MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,arr,(mtbdd_enum_filter_cb)0x0);
    if (MVar6 == 0) {
      if (lVar8 == 0) {
        return 0;
      }
      pcVar9 = "count == 64";
      uVar7 = 0xfd;
      goto LAB_00103069;
    }
  }
  pcVar9 = "count < 64";
  uVar7 = 0xfa;
LAB_00103069:
  fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
          "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c",
          uVar7,"int test_cube()",pcVar9);
  return 1;
}

Assistant:

int
test_cube()
{
    const BDDSET vars = sylvan_set_fromarray(((BDDVAR[]){1,2,3,4,6,8}), 6);

    uint8_t cube[6], check[6];
    int i, j;
    for (i=0;i<6;i++) cube[i] = rng(0,3);
    BDD bdd = sylvan_cube(vars, cube);

    sylvan_sat_one(bdd, vars, check);
    for (i=0; i<6;i++) test_assert(cube[i] == check[i] || (cube[i] == 2 && check[i] == 0));

    BDD picked_single = sylvan_pick_single_cube(bdd, vars);
    test_assert(testEqual(sylvan_and(picked_single, bdd), picked_single));
    assert(sylvan_satcount(picked_single, vars)==1);

    BDD picked = sylvan_pick_cube(bdd);
    test_assert(testEqual(sylvan_and(picked, bdd), picked));

    BDD t1 = sylvan_cube(vars, ((uint8_t[]){1,1,2,2,0,0}));
    BDD t2 = sylvan_cube(vars, ((uint8_t[]){1,1,1,0,0,2}));
    test_assert(testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){1,1,1,0,0,2})), sylvan_or(t1, t2)));
    t2 = sylvan_cube(vars, ((uint8_t[]){2,2,2,1,1,0}));
    test_assert(testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){2,2,2,1,1,0})), sylvan_or(t1, t2)));
    t2 = sylvan_cube(vars, ((uint8_t[]){1,1,1,0,0,0}));
    test_assert(testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){1,1,1,0,0,0})), sylvan_or(t1, t2)));

    bdd = make_random(1, 16);
    for (j=0;j<10;j++) {
        for (i=0;i<6;i++) cube[i] = rng(0,3);
        BDD c = sylvan_cube(vars, cube);
        test_assert(sylvan_union_cube(bdd, vars, cube) == sylvan_or(bdd, c));
    }

    for (i=0;i<10;i++) {
        picked = sylvan_pick_cube(bdd);
        test_assert(testEqual(sylvan_and(picked, bdd), picked));
    }

    // simple test for mtbdd_enum_all
    uint8_t arr[6];
    MTBDD leaf = mtbdd_enum_all_first(mtbdd_true, vars, arr, NULL);
    test_assert(leaf == mtbdd_true);
    test_assert(mtbdd_enum_all_first(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 0 && arr[5] == 0);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 0 && arr[5] == 1);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 1 && arr[5] == 0);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 1 && arr[5] == 1);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 0 && arr[5] == 0);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 0 && arr[5] == 1);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 1 && arr[5] == 0);

    mtbdd_enum_all_first(mtbdd_true, vars, arr, NULL);
    size_t count = 1;
    while (mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) != mtbdd_false) {
        test_assert(count < 64);
        count++;
    }
    test_assert(count == 64);

    return 0;
}